

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

bool __thiscall
sisl::sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_>::read_from_stream
          (sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_> *this,ifstream *stream)

{
  mapped_type mVar1;
  ulong uVar2;
  mapped_type *pmVar3;
  mapped_type local_44 [2];
  uint val;
  int key;
  int i_1;
  int i;
  uint size;
  uint _in_dims [3];
  uint sig;
  ifstream *stream_local;
  sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_> *this_local;
  
  unique0x10000228 = stream;
  uVar2 = std::ios::good();
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    _in_dims[1] = 0;
    i_1 = 0;
    std::istream::read((char *)stack0xffffffffffffffe0,(long)(_in_dims + 1));
    if (_in_dims[1] == 0x53534c53) {
      std::istream::read((char *)stack0xffffffffffffffe0,(long)&i);
      for (key = 0; key < 3; key = key + 1) {
        if ((&i)[key] != this->_dims[key]) {
          return false;
        }
      }
      std::istream::read((char *)stack0xffffffffffffffe0,(long)&i_1);
      std::
      unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
      ::clear(&this->siteMap);
      for (val = 0; val < (uint)i_1; val = val + 1) {
        local_44[1] = 0;
        local_44[0] = this->defaultValue;
        std::istream::read((char *)stack0xffffffffffffffe0,(long)(local_44 + 1));
        std::istream::read((char *)stack0xffffffffffffffe0,(long)local_44);
        mVar1 = local_44[0];
        if (local_44[0] != this->defaultValue) {
          pmVar3 = std::
                   unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[](&this->siteMap,(key_type *)(local_44 + 1));
          *pmVar3 = mVar1;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool read_from_stream(std::ifstream &stream) {
            if(!stream.good()) return false;

            unsigned int sig = 0;
            unsigned int _in_dims[N];
            unsigned int size = 0;

            // Check signature
            stream.read((char *)&sig, sizeof(unsigned int));
            if(sig != 0x53534c53) return false;

            // Check input dimensions
            stream.read(( char *)&_in_dims[0], N*sizeof(unsigned int));
            for(int i = 0; i < N; i++) {
                if(_in_dims[i] != _dims[i]) return false;
            }

            // Clear out the current map, and read into map
            stream.read((char *)&size, sizeof(unsigned int));
            siteMap.clear();
            for(int i = 0; i < size; ++i) {
                int key = 0;
                T val = defaultValue;

                stream.read((char *)&key, sizeof(unsigned int));
                stream.read((char *)&val, sizeof(T));

                if(val != defaultValue) {
                    siteMap[key] = val;
                }
            }
            return true;
        }